

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRun.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  char *__s1;
  bool testTimeTrace;
  bool verbose;
  bool runSpeedTests;
  bool testOutput;
  bool testTranslationSave;
  bool testTranslation;
  int iVar2;
  long lVar3;
  
  verbose = false;
  runSpeedTests = false;
  testOutput = false;
  testTranslationSave = false;
  testTranslation = false;
  testTimeTrace = false;
  for (lVar3 = 1; lVar3 < argc; lVar3 = lVar3 + 1) {
    __s1 = argv[lVar3];
    iVar2 = strcmp(__s1,"--verbose");
    if ((iVar2 == 0) || (((cVar1 = *__s1, cVar1 == '-' && (__s1[1] == 'v')) && (__s1[2] == '\0'))))
    {
      verbose = true;
    }
    else {
      iVar2 = strcmp(__s1,"--speed");
      if ((iVar2 == 0) || (((cVar1 == '-' && (__s1[1] == 's')) && (__s1[2] == '\0')))) {
        runSpeedTests = true;
      }
      else {
        iVar2 = strcmp(__s1,"--output");
        if ((iVar2 == 0) || (((cVar1 == '-' && (__s1[1] == 'o')) && (__s1[2] == '\0')))) {
          testOutput = true;
        }
        else {
          iVar2 = strcmp(__s1,"--translate");
          if ((iVar2 == 0) || (((cVar1 == '-' && (__s1[1] == 't')) && (__s1[2] == '\0')))) {
            testTranslationSave = true;
          }
          else {
            iVar2 = strcmp(__s1,"--executable");
            if ((iVar2 == 0) || (((cVar1 == '-' && (__s1[1] == 'e')) && (__s1[2] == '\0')))) {
              testTranslation = true;
            }
            else {
              iVar2 = strcmp(__s1,"--time-trace");
              if ((iVar2 == 0) || (((cVar1 == '-' && (__s1[1] == 'r')) && (__s1[2] == '\0')))) {
                testTimeTrace = true;
              }
            }
          }
        }
      }
    }
  }
  iVar2 = RunTests(verbose,(_func_char_ptr_char_ptr_uint_ptr *)0x0,(_func_void_char_ptr *)0x0,
                   runSpeedTests,testOutput,testTranslationSave,testTranslation,testTimeTrace);
  return iVar2;
}

Assistant:

int main(int argc, char** argv)
{
	(void)argv;

	bool verbose = false;
	bool runSpeedTests = false;
	bool testOutput = false;
	bool testTranslationSave = false;
	bool testTranslation = false;
	bool testTimeTrace = false;

	for(int i = 1; i < argc; i++)
	{
		if(strcmp(argv[i], "--verbose") == 0 || strcmp(argv[i], "-v") == 0)
			verbose = true;
		else if(strcmp(argv[i], "--speed") == 0 || strcmp(argv[i], "-s") == 0)
			runSpeedTests = true;
		else if(strcmp(argv[i], "--output") == 0 || strcmp(argv[i], "-o") == 0)
			testOutput = true;
		else if(strcmp(argv[i], "--translate") == 0 || strcmp(argv[i], "-t") == 0)
			testTranslationSave = true;
		else if(strcmp(argv[i], "--executable") == 0 || strcmp(argv[i], "-e") == 0)
			testTranslation = true;
		else if(strcmp(argv[i], "--time-trace") == 0 || strcmp(argv[i], "-r") == 0)
			testTimeTrace = true;
	}

	return RunTests(verbose, 0, 0, runSpeedTests, testOutput, testTranslationSave, testTranslation, testTimeTrace);
}